

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  char cVar9;
  int iVar10;
  char *pcVar11;
  short sVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  long *in_FS_OFFSET;
  
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar17 = j->code_buffer;
  uVar7 = (ulong)hdc->fast[uVar17 >> 0x17];
  if (uVar7 == 0xff) {
    lVar14 = 0;
    do {
      lVar8 = lVar14;
      lVar14 = lVar8 + 1;
    } while (hdc->maxcode[lVar8 + 10] <= uVar17 >> 0x10);
    iVar10 = j->code_bits;
    if (lVar14 == 8) {
      j->code_bits = iVar10 + -0x10;
      uVar13 = 0xffffffff;
    }
    else {
      uVar13 = 0xffffffff;
      if (((int)(lVar8 + 10) <= iVar10) &&
         (uVar16 = (uVar17 >> (0x17U - (char)lVar14 & 0x1f) & stbi__bmask[lVar8 + 10]) +
                   hdc->delta[lVar8 + 10], uVar16 < 0x100)) {
        j->code_bits = (iVar10 - (int)lVar14) + -9;
        j->code_buffer = uVar17 << ((byte)(lVar8 + 10) & 0x1f);
        uVar7 = (ulong)uVar16;
        goto LAB_0014275a;
      }
    }
  }
  else {
    bVar1 = hdc->size[uVar7];
    uVar13 = 0xffffffff;
    if ((int)(uint)bVar1 <= j->code_bits) {
      j->code_buffer = uVar17 << (bVar1 & 0x1f);
      j->code_bits = j->code_bits - (uint)bVar1;
LAB_0014275a:
      uVar13 = (uint)hdc->values[uVar7];
    }
  }
  if (uVar13 < 0x10) {
    data[0x38] = 0;
    data[0x39] = 0;
    data[0x3a] = 0;
    data[0x3b] = 0;
    data[0x3c] = 0;
    data[0x3d] = 0;
    data[0x3e] = 0;
    data[0x3f] = 0;
    data[0x30] = 0;
    data[0x31] = 0;
    data[0x32] = 0;
    data[0x33] = 0;
    data[0x34] = 0;
    data[0x35] = 0;
    data[0x36] = 0;
    data[0x37] = 0;
    data[0x28] = 0;
    data[0x29] = 0;
    data[0x2a] = 0;
    data[0x2b] = 0;
    data[0x2c] = 0;
    data[0x2d] = 0;
    data[0x2e] = 0;
    data[0x2f] = 0;
    data[0x20] = 0;
    data[0x21] = 0;
    data[0x22] = 0;
    data[0x23] = 0;
    data[0x24] = 0;
    data[0x25] = 0;
    data[0x26] = 0;
    data[0x27] = 0;
    data[0x18] = 0;
    data[0x19] = 0;
    data[0x1a] = 0;
    data[0x1b] = 0;
    data[0x1c] = 0;
    data[0x1d] = 0;
    data[0x1e] = 0;
    data[0x1f] = 0;
    data[0x10] = 0;
    data[0x11] = 0;
    data[0x12] = 0;
    data[0x13] = 0;
    data[0x14] = 0;
    data[0x15] = 0;
    data[0x16] = 0;
    data[0x17] = 0;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0;
    data[0xd] = 0;
    data[0xe] = 0;
    data[0xf] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    uVar17 = 0;
    if (uVar13 != 0) {
      if (j->code_bits < (int)uVar13) {
        stbi__grow_buffer_unsafe(j);
      }
      uVar17 = 0;
      if ((int)uVar13 <= j->code_bits) {
        uVar17 = j->code_buffer;
        bVar1 = (byte)uVar13 & 0x1f;
        uVar5 = uVar17 << bVar1 | uVar17 >> 0x20 - bVar1;
        uVar16 = stbi__bmask[uVar13];
        j->code_buffer = ~uVar16 & uVar5;
        j->code_bits = j->code_bits - uVar13;
        iVar10 = 0;
        if (-1 < (int)uVar17) {
          iVar10 = stbi__jbias[uVar13];
        }
        uVar17 = iVar10 + (uVar5 & uVar16);
      }
    }
    uVar13 = j->img_comp[b].dc_pred;
    if (-1 < (int)(uVar13 ^ uVar17)) {
      bVar3 = (int)uVar13 <= (int)(uVar17 ^ 0x7fffffff);
      if ((int)(uVar13 & uVar17) < 0) {
        bVar3 = (int)(-0x80000000 - uVar17) <= (int)uVar13;
      }
      if (!bVar3) {
        lVar14 = *in_FS_OFFSET;
        pcVar11 = "bad delta";
        goto LAB_00142c0d;
      }
    }
    iVar10 = uVar13 + uVar17;
    j->img_comp[b].dc_pred = iVar10;
    uVar2 = *dequant;
    if (uVar2 != 0) {
      if (iVar10 < 0) {
        bVar3 = -0x8000 / (int)(uint)uVar2 <= iVar10;
      }
      else {
        bVar3 = iVar10 <= (int)(0x7fff / uVar2);
      }
      if (!bVar3) {
        lVar14 = *in_FS_OFFSET;
        pcVar11 = "can\'t merge dc and ac";
        goto LAB_00142c0d;
      }
    }
    *data = uVar2 * (short)iVar10;
    lVar14 = *in_FS_OFFSET;
    iVar10 = 1;
    do {
      if (j->code_bits < 0x10) {
        stbi__grow_buffer_unsafe(j);
      }
      uVar2 = fac[j->code_buffer >> 0x17];
      if (uVar2 == 0) {
        if (j->code_bits < 0x10) {
          stbi__grow_buffer_unsafe(j);
        }
        uVar17 = j->code_buffer;
        uVar7 = (ulong)hac->fast[uVar17 >> 0x17];
        if (uVar7 == 0xff) {
          lVar8 = 0;
          do {
            lVar15 = lVar8;
            lVar8 = lVar15 + 1;
          } while (hac->maxcode[lVar15 + 10] <= uVar17 >> 0x10);
          iVar6 = j->code_bits;
          if (lVar8 == 8) {
            j->code_bits = iVar6 + -0x10;
            uVar13 = 0xffffffff;
          }
          else {
            uVar13 = 0xffffffff;
            if (((int)(lVar15 + 10) <= iVar6) &&
               (uVar16 = (uVar17 >> (0x17U - (char)lVar8 & 0x1f) & stbi__bmask[lVar15 + 10]) +
                         hac->delta[lVar15 + 10], uVar16 < 0x100)) {
              j->code_bits = (iVar6 - (int)lVar8) + -9;
              j->code_buffer = uVar17 << ((byte)(lVar15 + 10) & 0x1f);
              uVar7 = (ulong)uVar16;
              goto LAB_00142a19;
            }
          }
        }
        else {
          bVar1 = hac->size[uVar7];
          uVar13 = 0xffffffff;
          if ((int)(uint)bVar1 <= j->code_bits) {
            j->code_buffer = uVar17 << (bVar1 & 0x1f);
            j->code_bits = j->code_bits - (uint)bVar1;
LAB_00142a19:
            uVar13 = (uint)hac->values[uVar7];
          }
        }
        if ((int)uVar13 < 0) {
          *(undefined8 *)(lVar14 + -0x20) = "bad huffman code";
          cVar9 = '\x01';
        }
        else {
          uVar17 = uVar13 & 0xf;
          if (uVar17 == 0) {
            iVar6 = iVar10 + 0x10;
            if (uVar13 != 0xf0) {
              iVar6 = iVar10;
            }
            iVar10 = iVar6;
            cVar9 = (uVar13 != 0xf0) * '\x02';
          }
          else {
            lVar8 = (long)iVar10 + (ulong)(uVar13 >> 4);
            bVar1 = ""[lVar8];
            if (j->code_bits < (int)uVar17) {
              stbi__grow_buffer_unsafe(j);
            }
            sVar4 = 0;
            sVar12 = 0;
            if ((int)uVar17 <= j->code_bits) {
              uVar13 = j->code_buffer;
              uVar5 = uVar13 << (sbyte)uVar17 | uVar13 >> 0x20 - (sbyte)uVar17;
              uVar16 = *(uint *)((long)stbi__bmask + (ulong)(uVar17 << 2));
              j->code_buffer = ~uVar16 & uVar5;
              j->code_bits = j->code_bits - uVar17;
              if (-1 < (int)uVar13) {
                sVar4 = (short)*(undefined4 *)((long)stbi__jbias + (ulong)(uVar17 << 2));
              }
              sVar12 = ((ushort)uVar5 & (ushort)uVar16) + sVar4;
            }
            iVar10 = (int)lVar8 + 1;
            *(short *)((long)data + (ulong)((uint)bVar1 * 2)) =
                 sVar12 * *(short *)((long)dequant + (ulong)((uint)bVar1 * 2));
            cVar9 = '\0';
          }
        }
      }
      else {
        iVar10 = iVar10 + (uVar2 >> 4 & 0xf);
        uVar17 = uVar2 & 0xf;
        if (j->code_bits < (int)uVar17) {
          *(undefined8 *)(lVar14 + -0x20) = "bad huffman code";
          cVar9 = '\x01';
        }
        else {
          j->code_buffer = j->code_buffer << (sbyte)uVar17;
          j->code_bits = j->code_bits - uVar17;
          lVar8 = (long)iVar10;
          iVar10 = iVar10 + 1;
          *(short *)((long)data + (ulong)((uint)""[lVar8] * 2)) =
               (short)(char)(uVar2 >> 8) * *(short *)((long)dequant + (ulong)((uint)""[lVar8] * 2));
          cVar9 = '\0';
        }
      }
      iVar6 = 1;
      if (cVar9 != '\0') {
        if (cVar9 == '\x02') {
          return 1;
        }
        goto LAB_00142c14;
      }
    } while (iVar10 < 0x40);
  }
  else {
    lVar14 = *in_FS_OFFSET;
    pcVar11 = "bad huffman code";
LAB_00142c0d:
    *(char **)(lVar14 + -0x20) = pcVar11;
LAB_00142c14:
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0 || t > 15) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta","Corrupt JPEG");
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   if (!stbi__mul2shorts_valid(dc, dequant[0])) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         if (s > j->code_bits) return stbi__err("bad huffman code", "Combined length longer than code bits available");
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}